

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatch.cpp
# Opt level: O2

int BmatchCommandInitTwoCircuits(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  abctime aVar4;
  uint verbose;
  int fDelete2;
  int fDelete1;
  abctime local_50;
  Abc_Frame_t *local_48;
  Abc_Ntk_t *pNtk2;
  Abc_Ntk_t *pNtk1;
  
  fDelete1 = 0;
  fDelete2 = 0;
  local_48 = pAbc;
  local_50 = Abc_Clock();
  Extra_UtilGetoptReset();
  verbose = 0;
  bVar2 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          do {
            while( true ) {
              while( true ) {
                while (bVar1 = bVar2, iVar3 = Extra_UtilGetopt(argc,argv,"aAvVdRITh"), bVar2 = bVar1
                      , iVar3 == 0x41) {
                  verbose = verbose | 0xf;
                }
                if (iVar3 != 0x49) break;
                verbose = verbose | 0x20;
              }
              if (iVar3 != 0x52) break;
              verbose = verbose | 0x10;
            }
            bVar2 = true;
          } while (iVar3 == 0x54);
          if (iVar3 != 0x56) break;
          verbose = verbose | 4;
          bVar2 = bVar1;
        }
        if (iVar3 != 0x61) break;
        verbose = verbose | 3;
        bVar2 = bVar1;
      }
      if (iVar3 != 100) break;
      verbose = verbose | 8;
      bVar2 = bVar1;
    }
    if (iVar3 != 0x76) break;
    verbose = verbose | 1;
    bVar2 = bVar1;
  }
  if (iVar3 == -1) {
    if (argc - globalUtilOptind == 2) {
      iVar3 = Abc_NtkPrepareTwoNtks
                        (_stdout,(Abc_Ntk_t *)0x0,argv + globalUtilOptind,2,&pNtk1,&pNtk2,&fDelete1,
                         &fDelete2);
      if (iVar3 == 0) {
        return 1;
      }
      Bmatch_PrepNtks(local_48,pNtk1,pNtk2,verbose);
      if (bVar1) {
        Abc_Print(1,"%s =","Total runtime");
        aVar4 = Abc_Clock();
        Abc_Print(1,"%9.2f sec\n",(double)(aVar4 - local_50) / 1000000.0);
        return 0;
      }
      return 0;
    }
    puts("Invalid command!");
  }
  Abc_Print(-2,"usage: bmatchInit [-aAvVdRIT] <file1> <file2> \n");
  Abc_Print(-2,"       -v verbose \n");
  Abc_Print(-2,"       -a all verbose \n");
  Abc_Print(-2,"       -V supp information \n");
  Abc_Print(-2,"       -A All message \n");
  Abc_Print(-2,"       -d debug message \n");
  Abc_Print(-2,"       -R Resync cir1 & cir2 \n");
  Abc_Print(-2,"       -I show PI information \n");
  Abc_Print(-2,"       -T Print time information \n");
  return 1;
}

Assistant:

int BmatchCommandInitTwoCircuits( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, fDelete1 = 0, fDelete2 = 0;
    char ** pArgvNew;
    int nArgcNew;
    Abc_Ntk_t * pNtk1, * pNtk2;
    int pVerbose = 0, pTime = 0;
    abctime clkTotal = Abc_Clock();
 
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "aAvVdRITh" ) ) != EOF )
    {
        switch ( c )
        {
            case 'v':   pVerbose |= 1;  break;
            case 'a':   pVerbose |= 3;  break;
            case 'V':   pVerbose |= 4;  break;
            case 'd':   pVerbose |= 8;  break;
            case 'A':   pVerbose |= 15; break;
            case 'R':   pVerbose |= 16; break;
            case 'I':   pVerbose |= 32; break;
            case 'T':   pTime = 1;      break;
            default:    goto usage;
        }
    }

    pArgvNew = argv + globalUtilOptind;
    nArgcNew = argc - globalUtilOptind;
    if( nArgcNew != 2 )
    {
        printf("Invalid command!\n");
        goto usage;
    }
    if ( !Abc_NtkPrepareTwoNtks( stdout, NULL, pArgvNew, nArgcNew, &pNtk1, &pNtk2, &fDelete1, &fDelete2 ) )
        return 1;

    Bmatch_PrepNtks( pAbc, pNtk1, pNtk2, pVerbose );
    
    if( pTime )
        ABC_PRT( "Total runtime", Abc_Clock() - clkTotal );

    return 0;

usage:
    Abc_Print( -2, "usage: bmatchInit [-aAvVdRIT] <file1> <file2> \n" );
    Abc_Print( -2, "       -v verbose \n" );
    Abc_Print( -2, "       -a all verbose \n" );
    Abc_Print( -2, "       -V supp information \n" );
    Abc_Print( -2, "       -A All message \n" );
    Abc_Print( -2, "       -d debug message \n" );
    Abc_Print( -2, "       -R Resync cir1 & cir2 \n" );
    Abc_Print( -2, "       -I show PI information \n" );
    Abc_Print( -2, "       -T Print time information \n" );
    return 1;
}